

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectivePosition::writeTempData(CDirectivePosition *this,TempData *tempData)

{
  int64_t iVar1;
  string local_38;
  
  if (this->type == Virtual) {
    iVar1 = this->virtualAddress;
    tinyformat::format<long>(&local_38,".org 0x%08X",&this->position);
    TempData::writeLine(tempData,iVar1,&local_38);
  }
  else {
    if (this->type != Physical) {
      return;
    }
    iVar1 = this->virtualAddress;
    tinyformat::format<long>(&local_38,".orga 0x%08X",&this->position);
    TempData::writeLine(tempData,iVar1,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CDirectivePosition::writeTempData(TempData& tempData) const
{
	switch (type)
	{
	case Physical:
		tempData.writeLine(virtualAddress,tfm::format(".orga 0x%08X",position));
		break;
	case Virtual:
		tempData.writeLine(virtualAddress,tfm::format(".org 0x%08X",position));
		break;
	}
}